

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O0

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstanceBase::DrawTestInstanceBase
          (DrawTestInstanceBase *this,Context *context)

{
  DeviceInterface *pDVar1;
  Context *context_local;
  DrawTestInstanceBase *this_local;
  
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR___cxa_pure_virtual_0166aca0;
  DrawParamsBase::DrawParamsBase(&this->m_data);
  pDVar1 = Context::getDeviceInterface(context);
  this->m_vk = pDVar1;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::Move(&this->m_pipeline);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::Move(&this->m_pipelineLayout);
  this->m_colorAttachmentFormat = VK_FORMAT_R8G8B8A8_UNORM;
  de::SharedPtr<vkt::Draw::Image>::SharedPtr(&this->m_colorTargetImage);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_colorTargetView);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::Move(&this->m_renderPass);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::Move(&this->m_framebuffer);
  PipelineCreateInfo::VertexInputState::VertexInputState
            (&this->m_vertexInputState,0,(VkVertexInputBindingDescription *)0x0,0,
             (VkVertexInputAttributeDescription *)0x0);
  de::SharedPtr<vkt::Draw::Buffer>::SharedPtr(&this->m_vertexBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::Move(&this->m_cmdPool);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::Move(&this->m_cmdBuffer);
  return;
}

Assistant:

DrawTestInstanceBase::DrawTestInstanceBase (Context& context)
	: vkt::TestInstance			(context)
	, m_vk						(context.getDeviceInterface())
	, m_colorAttachmentFormat	(vk::VK_FORMAT_R8G8B8A8_UNORM)
{
}